

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPSIO.cpp
# Opt level: O2

int writeMPS_dense(char *filename,int *numRow,int *numCol,int *objSense,double *objOffset,
                  vector<double,_std::allocator<double>_> *A_cw,
                  vector<double,_std::allocator<double>_> *rhs,
                  vector<double,_std::allocator<double>_> *cost,
                  vector<double,_std::allocator<double>_> *lb,
                  vector<double,_std::allocator<double>_> *ub,
                  vector<int,_std::allocator<int>_> *integerColumn)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  pointer pdVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  vector<int,_std::allocator<int>_> Aindex;
  vector<int,_std::allocator<int>_> Astart;
  vector<double,_std::allocator<double>_> Avalue;
  
  uVar7 = 0;
  printf("writeMPS_dense: Model has %d rows and %d columns\n",(ulong)(uint)*numRow,
         (ulong)(uint)*numCol);
  printf("writeMPS_dense: Objective sense is %d; Objective offset is %g\n",*objOffset,
         (ulong)(uint)*objSense);
  std::ostream::flush();
  Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Aindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  Aindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  Aindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Avalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  Avalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  Avalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar2 = *numRow;
  uVar4 = 0;
  if (0 < (int)uVar2) {
    uVar4 = (ulong)uVar2;
  }
  uVar5 = (ulong)(uint)*numCol;
  if (*numCol < 1) {
    uVar5 = uVar7;
  }
  pdVar8 = (A_cw->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar11 = 0;
  for (; uVar7 != uVar5; uVar7 = uVar7 + 1) {
    for (uVar9 = 0; uVar4 != uVar9; uVar9 = uVar9 + 1) {
      uVar11 = uVar11 + (pdVar8[uVar9] != 0.0);
    }
    pdVar8 = pdVar8 + (int)uVar2;
  }
  printf("Model has %d nonzeros\n",(ulong)uVar11);
  std::ostream::flush();
  std::vector<int,_std::allocator<int>_>::resize(&Astart,(long)*numCol + 1);
  std::vector<int,_std::allocator<int>_>::resize(&Aindex,(long)(int)uVar11);
  std::vector<double,_std::allocator<double>_>::resize(&Avalue,(long)(int)uVar11);
  *Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start = 0
  ;
  iVar3 = 0;
  for (lVar6 = 0; lVar6 < *numCol; lVar6 = lVar6 + 1) {
    pdVar8 = (A_cw->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (iVar10 = 0; iVar10 < *numRow; iVar10 = iVar10 + 1) {
      dVar1 = pdVar8[*numRow * (int)lVar6 + iVar10];
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        Aindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar3] = iVar10;
        Avalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar3] = dVar1;
        iVar3 = iVar3 + 1;
      }
    }
    Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [lVar6 + 1] = iVar3;
  }
  puts("writeMPS_dense: calling writeMPS_sparse");
  std::ostream::flush();
  iVar3 = writeMPS_sparse(filename,numRow,numCol,objSense,objOffset,&Astart,&Aindex,&Avalue,rhs,cost
                          ,lb,ub,integerColumn);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&Avalue.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&Aindex.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&Astart.super__Vector_base<int,_std::allocator<int>_>);
  return iVar3;
}

Assistant:

int writeMPS_dense(const char *filename, int& numRow, int& numCol, int& objSense, double& objOffset,
		   vector<double>& A_cw,
		   vector<double>& rhs, vector<double>& cost, vector<double>& lb, vector<double>& ub,
		   vector<int>& integerColumn) {
#ifdef JAJH_dev
  printf("writeMPS_dense: Model has %d rows and %d columns\n", numRow, numCol);
  printf("writeMPS_dense: Objective sense is %d; Objective offset is %g\n", objSense, objOffset);
  cout<<flush;
#endif
  
  vector<int> Astart;
  vector<int> Aindex;
  vector<double> Avalue;
  int numNz = 0;
  for (int c_n = 0; c_n<numCol; c_n++) {
    for (int r_n = 0; r_n<numRow; r_n++) {
      double r_v = A_cw[r_n+c_n*numRow];
      if (r_v != 0) numNz++;
    }
  }
  printf("Model has %d nonzeros\n", numNz);cout<<flush;
  Astart.resize(numCol+1);
  Aindex.resize(numNz);
  Avalue.resize(numNz);
  Astart[0] = 0;
  for (int c_n = 0; c_n<numCol; c_n++) {
    int el_n = Astart[c_n];
    for (int r_n = 0; r_n<numRow; r_n++) {
      double r_v = A_cw[r_n+c_n*numRow];
      if (r_v != 0) {
  	Aindex[el_n] = r_n;
  	Avalue[el_n] = r_v;
  	el_n++;
      }
    }
    Astart[c_n+1] = el_n;
  }
  printf("writeMPS_dense: calling writeMPS_sparse\n"); cout<<flush;
  int rtCd = writeMPS_sparse(filename, numRow, numCol, objSense, objOffset,
			    Astart, Aindex, Avalue,
			    rhs, cost, lb, ub,
			    integerColumn);
  return rtCd;
}